

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::UnpackUnorm4x8Case::iterate(UnpackUnorm4x8Case *this)

{
  ShaderExecutor *pSVar1;
  uint6 uVar2;
  deUint32 dVar3;
  ostream *poVar4;
  ostream *poVar5;
  TestLog *pTVar6;
  uint *puVar7;
  uint uVar8;
  char *description;
  int iVar9;
  long lVar10;
  UnpackUnorm4x8Case *pUVar11;
  ostringstream *poVar12;
  long lVar13;
  float fVar16;
  float fVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar18;
  undefined1 auVar19 [16];
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32_3;
  deUint32 u32_5;
  deUint32 u32_7;
  deUint32 u32;
  deUint32 u32_6;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  deUint32 u32_2;
  deUint32 u32_4;
  Random rnd;
  void *in;
  Hex<8UL> local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  UnpackUnorm4x8Case *local_258;
  long local_250;
  uint local_248;
  uint local_244;
  uint local_240;
  int local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  undefined1 local_208 [16];
  pointer local_1f8;
  ulong local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  
  local_258 = this;
  dVar3 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar3 ^ 0x776002);
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1f8 = (pointer)0x0;
  local_208 = (undefined1  [16])0x0;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_278,(iterator)0x0,(uint *)local_1b0);
  local_1b0._0_4_ = 0x7fff8000;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x80007fff;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0xffffffff;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x1fffe;
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_278,
               (iterator)
               local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar9 = 0x5f;
  do {
    dVar3 = deRandom_getUint32(&local_1c0);
    local_1b0._0_4_ = dVar3;
    if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_278,
                 (iterator)
                 local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1b0);
    }
    else {
      *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar3;
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_208,
             (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1b0._0_8_ =
       ((local_258->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar12 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar12,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar12);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  pUVar11 = local_258;
  local_1b0._0_8_ =
       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_280.value = local_208._0_8_;
  (*((local_258->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (pUVar11->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar1->_vptr_ShaderExecutor[6])
            (pSVar1,(ulong)((long)local_278.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_278.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1b0,&local_280
            );
  local_1f0 = (ulong)((long)local_278.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  pUVar11 = local_258;
  if ((int)local_1f0 < 1) {
    iVar9 = 0;
  }
  else {
    lVar10 = 0;
    lVar13 = 0xc;
    iVar9 = 0;
    pTVar6 = (TestLog *)
             local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      poVar12 = (ostringstream *)(local_1b0 + 8);
      uVar8 = *(uint *)((long)&pTVar6->m_log + lVar10 * 4);
      uVar2 = CONCAT24((short)(uVar8 >> 0x10),uVar8 >> 0x18) & 0xffffffffff;
      auVar14._0_4_ = (float)(int)uVar2;
      auVar14._4_4_ = (float)(ushort)(uVar2 >> 0x20);
      auVar14._8_4_ = (float)((ushort)(uVar8 >> 8) & 0xff);
      auVar14._12_4_ = (float)(uVar8 & 0xff);
      auVar15._8_4_ = 0x437f0000;
      auVar15._0_8_ = 0x437f0000437f0000;
      auVar15._12_4_ = 0x437f0000;
      auVar15 = divps(auVar14,auVar15);
      fVar16 = auVar15._4_4_;
      fVar17 = auVar15._8_4_;
      fVar18 = auVar15._12_4_;
      auVar19._4_4_ = -(uint)(1.0 < fVar16);
      auVar19._0_4_ = -(uint)(1.0 < auVar15._0_4_);
      auVar19._8_4_ = -(uint)(1.0 < fVar17);
      auVar19._12_4_ = -(uint)(1.0 < fVar18);
      uVar8 = movmskps(uVar8 & 0xff,auVar19);
      local_218 = 1.0;
      if ((uVar8 & 1) == 0) {
        local_218 = auVar15._0_4_;
      }
      local_238 = *(float *)((long)(float *)local_208._0_8_ + lVar13);
      local_248 = (int)local_238 - (int)local_218;
      if ((uint)local_238 < (uint)local_218) {
        local_248 = -((int)local_238 - (int)local_218);
      }
      local_210 = 1.0;
      fStack_1e4 = 0.0;
      if ((uVar8 & 2) == 0) {
        local_210 = fVar16;
        fStack_1e4 = fVar16;
      }
      local_230 = *(float *)((long)(float *)local_208._0_8_ + lVar13 + -4);
      local_244 = (int)local_230 - (int)local_210;
      if ((uint)local_230 < (uint)local_210) {
        local_244 = -((int)local_230 - (int)local_210);
      }
      fVar16 = 1.0;
      fStack_1d0 = 0.0;
      fStack_1d4 = 0.0;
      if ((uVar8 & 4) == 0) {
        fVar16 = fVar17;
        fStack_1d0 = fVar17;
        fStack_1d4 = fVar18;
      }
      local_228 = *(float *)((long)(float *)local_208._0_8_ + lVar13 + -8);
      local_240 = (int)local_228 - (int)fVar16;
      if ((uint)local_228 < (uint)fVar16) {
        local_240 = -((int)local_228 - (int)fVar16);
      }
      fVar17 = 1.0;
      if ((uVar8 & 8) == 0) {
        fVar17 = fVar18;
      }
      local_220 = *(float *)((long)(float *)local_208._0_8_ + lVar13 + -0xc);
      uVar8 = (int)local_220 - (int)fVar17;
      if ((uint)local_220 < (uint)fVar17) {
        uVar8 = -((int)local_220 - (int)fVar17);
      }
      local_250 = lVar10;
      local_234 = local_238;
      local_22c = local_230;
      local_224 = local_228;
      local_21c = local_220;
      local_214 = local_218;
      local_20c = fVar17;
      local_1e8 = local_210;
      fStack_1e0 = fStack_1e4;
      fStack_1dc = fStack_1e4;
      local_1d8 = fVar16;
      fStack_1cc = fStack_1d4;
      if (((1 < uVar8) || (1 < local_240)) || (1 < (local_244 | local_248))) {
        if (iVar9 < 10) {
          local_1b0._0_8_ =
               ((pUVar11->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar12 = (ostringstream *)(local_1b0 + 8);
          local_23c = iVar9;
          std::__cxx11::ostringstream::ostringstream(poVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar12,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar12,(int)local_250);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar12,"  expected unpackUnorm4x8(",0x1a);
          local_280.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_278.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_250 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_280,(ostream *)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"vec4(",5);
          poVar4 = std::ostream::_M_insert<double>((double)local_20c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_280.value = (deUint64)(uint)fVar17;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),", ",2);
          poVar4 = (ostream *)(local_1b0 + 8);
          poVar5 = std::ostream::_M_insert<double>((double)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_280.value = (deUint64)(uint)fVar16;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          poVar5 = std::ostream::_M_insert<double>((double)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_280.value = (deUint64)(uint)local_210;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          poVar5 = std::ostream::_M_insert<double>((double)local_214);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_280.value = (deUint64)(uint)local_218;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", got vec4(",0xb);
          poVar5 = std::ostream::_M_insert<double>((double)local_21c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_280.value = (deUint64)(uint)local_220;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          poVar5 = std::ostream::_M_insert<double>((double)local_224);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_280.value = (deUint64)(uint)local_228;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          poVar5 = std::ostream::_M_insert<double>((double)local_22c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_280.value = (deUint64)(uint)local_230;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          poVar5 = std::ostream::_M_insert<double>((double)local_234);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_280.value = (deUint64)(uint)local_238;
          tcu::Format::Hex<8UL>::toStream(&local_280,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar4);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          pUVar11 = local_258;
          iVar9 = local_23c;
        }
        else if (iVar9 == 10) {
          local_1b0._0_8_ =
               ((pUVar11->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar12);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          pUVar11 = local_258;
        }
        iVar9 = iVar9 + 1;
        pTVar6 = (TestLog *)
                 local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar10 = local_250 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar10 < (int)((ulong)((long)puVar7 - (long)pTVar6) >> 2));
  }
  local_1b0._0_8_ =
       ((pUVar11->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar12 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar12);
  std::ostream::operator<<(poVar12,(int)local_1f0 - iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," / ",3);
  std::ostream::operator<<(poVar12,(int)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar12);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  description = "Pass";
  if (iVar9 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((local_258->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,(uint)(iVar9 != 0),description);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_,(long)local_1f8 - local_208._0_8_);
  }
  if ((TestLog *)
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint8	in0		= (deUint8)(inputs[valNdx] & 0xff);
				const deUint8	in1		= (deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deUint8	in2		= (deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deUint8	in3		= (deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 255.f, 0.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 255.f, 0.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 255.f, 0.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 255.f, 0.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackUnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}